

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::Header::Build(Header *this,tzhead *tzh)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  lVar1 = 0;
  uVar3 = 0;
  do {
    uVar4 = uVar3 << 8;
    uVar3 = (byte)tzh->tzh_timecnt[lVar1] | uVar4;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 4);
  uVar2 = uVar3 - 0x100000000;
  if (uVar4 >> 0x1f == 0) {
    uVar2 = uVar3;
  }
  if (-1 < (long)uVar2) {
    this->timecnt = uVar2;
    lVar1 = 0;
    uVar3 = 0;
    do {
      uVar4 = uVar3 << 8;
      uVar3 = (byte)tzh->tzh_typecnt[lVar1] | uVar4;
      lVar1 = lVar1 + 1;
    } while ((int)lVar1 != 4);
    sVar5 = uVar3 - 0x100000000;
    if (uVar4 < 0x80000000) {
      sVar5 = uVar3;
    }
    if (-1 < (long)sVar5) {
      this->typecnt = sVar5;
      lVar1 = 0;
      uVar3 = 0;
      do {
        uVar4 = uVar3 << 8;
        uVar3 = (byte)tzh->tzh_charcnt[lVar1] | uVar4;
        lVar1 = lVar1 + 1;
      } while ((int)lVar1 != 4);
      sVar5 = uVar3 - 0x100000000;
      if (uVar4 < 0x80000000) {
        sVar5 = uVar3;
      }
      if (-1 < (long)sVar5) {
        this->charcnt = sVar5;
        lVar1 = 0;
        uVar3 = 0;
        do {
          uVar4 = uVar3 << 8;
          uVar3 = (byte)tzh->tzh_leapcnt[lVar1] | uVar4;
          lVar1 = lVar1 + 1;
        } while ((int)lVar1 != 4);
        sVar5 = uVar3 - 0x100000000;
        if (uVar4 < 0x80000000) {
          sVar5 = uVar3;
        }
        if (-1 < (long)sVar5) {
          this->leapcnt = sVar5;
          lVar1 = 0;
          uVar3 = 0;
          do {
            uVar4 = uVar3 << 8;
            uVar3 = (byte)tzh->tzh_ttisstdcnt[lVar1] | uVar4;
            lVar1 = lVar1 + 1;
          } while ((int)lVar1 != 4);
          sVar5 = uVar3 - 0x100000000;
          if (uVar4 < 0x80000000) {
            sVar5 = uVar3;
          }
          if (-1 < (long)sVar5) {
            this->ttisstdcnt = sVar5;
            lVar1 = 0;
            uVar3 = 0;
            do {
              uVar4 = uVar3 << 8;
              uVar3 = (byte)tzh->tzh_ttisutcnt[lVar1] | uVar4;
              lVar1 = lVar1 + 1;
            } while ((int)lVar1 != 4);
            uVar2 = uVar3 - 0x100000000;
            if (uVar4 < 0x80000000) {
              uVar2 = uVar3;
            }
            if (-1 < (long)uVar2) {
              this->ttisutcnt = uVar2;
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Header::Build(const tzhead& tzh) {
  std::int_fast32_t v;
  if ((v = Decode32(tzh.tzh_timecnt)) < 0) return false;
  timecnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_typecnt)) < 0) return false;
  typecnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_charcnt)) < 0) return false;
  charcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_leapcnt)) < 0) return false;
  leapcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_ttisstdcnt)) < 0) return false;
  ttisstdcnt = static_cast<std::size_t>(v);
  if ((v = Decode32(tzh.tzh_ttisutcnt)) < 0) return false;
  ttisutcnt = static_cast<std::size_t>(v);
  return true;
}